

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Order.cpp
# Opt level: O0

bool operator<(Order *lhs,Order *rhs)

{
  int iVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  Order *rhs_local;
  Order *lhs_local;
  
  dVar3 = Order::getOrderPrice(lhs);
  dVar4 = Order::getOrderPrice(rhs);
  if (dVar4 <= dVar3) {
    dVar3 = Order::getOrderPrice(lhs);
    dVar4 = Order::getOrderPrice(rhs);
    if (dVar3 <= dVar4) {
      dVar3 = Order::getOrderPrice(lhs);
      dVar4 = Order::getOrderPrice(rhs);
      if ((dVar3 != dVar4) || (NAN(dVar3) || NAN(dVar4))) {
        lhs_local._7_1_ = false;
      }
      else {
        iVar1 = Order::getSeqId(lhs);
        iVar2 = Order::getSeqId(rhs);
        lhs_local._7_1_ = iVar1 < iVar2;
      }
    }
    else {
      lhs_local._7_1_ = false;
    }
  }
  else {
    lhs_local._7_1_ = true;
  }
  return lhs_local._7_1_;
}

Assistant:

bool operator < (const Order& lhs, const Order& rhs)
{
	// This is a 2 criteria sorter. First by price. if prices are same then by seqId. The lesser the seqId the earlier the order had come hence it is given priority in the queue.
	if(lhs.getOrderPrice() < rhs.getOrderPrice())
	{
		return(true);
	}

	if(lhs.getOrderPrice() > rhs.getOrderPrice())
	{
		return(false);
	}

	if(lhs.getOrderPrice() == rhs.getOrderPrice())
	{
		return(lhs.getSeqId() < rhs.getSeqId());
	}
 return(false);
}